

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# btree_str_kv_test.cc
# Opt level: O2

void kv_init_ops_test(void)

{
  int iVar1;
  btree_kv_ops *kv_ops;
  btree_kv_ops *__s2;
  char *__format;
  timeval __test_begin;
  
  gettimeofday((timeval *)&__test_begin,(__timezone_ptr_t)0x0);
  memleak_start();
  kv_ops = btree_str_kv_get_kb64_vb64((btree_kv_ops *)0x0);
  if (kv_ops == (btree_kv_ops *)0x0) {
    fprintf(_stderr,"Test failed: %s %d\n",
            "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/unit/btree_str_kv_test.cc"
            ,0x9e);
    kv_init_ops_test()::__test_pass = 1;
    __assert_fail("kv_ops != __null",
                  "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/unit/btree_str_kv_test.cc"
                  ,0x9e,"void kv_init_ops_test()");
  }
  __s2 = btree_str_kv_get_kb64_vb64(kv_ops);
  if (__s2 != (btree_kv_ops *)0x0) {
    iVar1 = bcmp(kv_ops,__s2,0x78);
    if (iVar1 != 0) {
      fprintf(_stderr,"Test failed: %s %d\n",
              "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/unit/btree_str_kv_test.cc"
              ,0xa3);
      kv_init_ops_test()::__test_pass = '\x01';
      iVar1 = bcmp(kv_ops,__s2,0x78);
      if (iVar1 != 0) {
        __assert_fail("memcmp(kv_ops, kv_ops_copy, sizeof(btree_kv_ops)) == 0",
                      "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/tests/unit/btree_str_kv_test.cc"
                      ,0xa3,"void kv_init_ops_test()");
      }
    }
  }
  free(kv_ops);
  memleak_end();
  __format = "%s PASSED\n";
  if (kv_init_ops_test()::__test_pass != '\0') {
    __format = "%s FAILED\n";
  }
  fprintf(_stderr,__format,"kv init ops test");
  return;
}

Assistant:

void kv_init_ops_test()
{
    TEST_INIT();
    memleak_start();

    // init with null
    btree_kv_ops *kv_ops = btree_str_kv_get_kb64_vb64(NULL);
    TEST_CHK(kv_ops != NULL);

    // re-init with existing ops
    btree_kv_ops *kv_ops_copy =  btree_str_kv_get_kb64_vb64(kv_ops);
    if (kv_ops && kv_ops_copy) {
        TEST_CHK(memcmp(kv_ops, kv_ops_copy, sizeof(btree_kv_ops)) == 0);
    }

    free(kv_ops);
    memleak_end();
    TEST_RESULT("kv init ops test");
}